

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.c
# Opt level: O1

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  if (buflen == 0) {
    return 1;
  }
  u->field_set = 0;
  u->port = 0;
  if ((long)buflen < 1) {
    iVar6 = 4;
    if ((u->field_set & 3) == 1) {
      return 1;
    }
    if ((u->field_set & 2) != 0) {
      uVar7 = (ulong)u->field_data[1].len;
      uVar10 = (ulong)u->field_data[1].off;
      u->field_data[1].len = 0;
      if (uVar7 == 0) {
        iVar6 = 4;
      }
      else {
        lVar3 = uVar7 + uVar10;
        do {
          if (10 < iVar6 - 2U) goto LAB_00108f49;
          bVar1 = buf[uVar10];
          uVar11 = (uint)bVar1;
          switch(iVar6) {
          default:
            if (uVar11 == 0x40) {
              iVar5 = 4;
              break;
            }
            bVar13 = false;
            iVar12 = 3;
            if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 | 0x20) + 0x9f))) {
              uVar8 = bVar1 - 0x21;
              iVar12 = 3;
              if (uVar8 < 0x3f) {
                uVar7 = 0x4000000016003ff9;
                goto LAB_00108ee2;
              }
              goto LAB_00108ee8;
            }
            goto LAB_00108f52;
          case 4:
            if (uVar11 == 0x5b) {
              iVar5 = 5;
            }
            else {
              iVar5 = 6;
              if ((0x19 < (byte)((bVar1 | 0x20) + 0x9f)) &&
                 (1 < (byte)(bVar1 - 0x2d) && 9 < (byte)(bVar1 - 0x30))) goto LAB_00108f49;
            }
            break;
          case 5:
switchD_00108d8e_caseD_5:
            iVar12 = 7;
            iVar5 = 7;
            if (9 < (byte)(bVar1 - 0x30)) {
              if ((bVar1 | 0x20) < 0x61) {
                bVar13 = false;
                if ((uVar11 == 0x2e) || (uVar11 == 0x3a)) goto LAB_00108f52;
              }
              else if ((bVar1 | 0x20) < 0x67) break;
              if ((iVar6 == 7) && (bVar1 == 0x25)) {
                bVar13 = false;
                iVar12 = 9;
                goto LAB_00108f52;
              }
              goto LAB_00108f49;
            }
            break;
          case 6:
            iVar5 = 6;
            if ((0x19 < (byte)((bVar1 | 0x20) + 0x9f)) &&
               (1 < (byte)(bVar1 - 0x2d) && 9 < (byte)(bVar1 - 0x30)))
            goto switchD_00108d8e_caseD_8;
            break;
          case 7:
            if (uVar11 != 0x5d) goto switchD_00108d8e_caseD_5;
LAB_00108e9a:
            iVar5 = 8;
            break;
          case 8:
switchD_00108d8e_caseD_8:
            if (uVar11 != 0x3a) goto LAB_00108f49;
            iVar5 = 0xb;
            break;
          case 9:
            goto switchD_00108d8e_caseD_9;
          case 10:
            if (uVar11 == 0x5d) goto LAB_00108e9a;
switchD_00108d8e_caseD_9:
            iVar12 = 10;
            bVar13 = false;
            if ((9 < (byte)(bVar1 - 0x30)) && (bVar13 = false, 0x19 < (byte)((bVar1 | 0x20) + 0x9f))
               ) {
              uVar8 = uVar11 - 0x25;
              iVar12 = 10;
              if (uVar8 < 0x3b) {
                uVar7 = 0x400000000000301;
LAB_00108ee2:
                bVar13 = false;
                if ((uVar7 >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_00108f52;
              }
LAB_00108ee8:
              bVar13 = false;
              if (uVar11 != 0x7e) {
LAB_00108f49:
                iVar12 = 1;
                bVar13 = true;
              }
            }
            goto LAB_00108f52;
          case 0xb:
          case 0xc:
            if (9 < (byte)(bVar1 - 0x30)) goto LAB_00108f49;
            iVar5 = 0xc;
          }
          iVar12 = iVar5;
          bVar13 = false;
LAB_00108f52:
          if ((!bVar13) && (iVar6 = iVar12, iVar12 - 3U < 10)) {
            iVar6 = (*(code *)(&DAT_0010d39c + *(int *)(&DAT_0010d39c + (ulong)(iVar12 - 3U) * 4)))
                              (buf,buflen,
                               &DAT_0010d39c + *(int *)(&DAT_0010d39c + (ulong)(iVar12 - 3U) * 4));
            return iVar6;
          }
          if (bVar13) {
            return 1;
          }
          lVar4 = uVar10 + 1;
          uVar10 = uVar10 + 1;
        } while (buf + lVar4 < buf + lVar3);
      }
      if ((iVar6 - 2U < 10) && ((0x3afU >> (iVar6 - 2U & 0x1f) & 1) != 0)) {
        return 1;
      }
    }
    if ((is_connect != 0) && (u->field_set != 6)) {
      return 1;
    }
    if ((u->field_set & 4) != 0) {
      uVar7 = (ulong)u->field_data[2].off;
      uVar2 = u->field_data[2].len;
      if (buflen < uVar2 + uVar7) {
        __assert_fail("off + len <= buflen && \"Port number overflow\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                      ,0x27c,
                      "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                     );
      }
      bVar13 = uVar2 != 0;
      if (uVar2 == 0) {
        uVar10 = 0;
LAB_00109099:
        u->port = (uint16_t)uVar10;
      }
      else {
        uVar10 = (long)buf[uVar7] - 0x30;
        if (uVar10 < 0x10000) {
          pcVar9 = buf + uVar7;
          do {
            pcVar9 = pcVar9 + 1;
            bVar13 = pcVar9 < buf + uVar7 + uVar2;
            if (!bVar13) goto LAB_00109099;
            uVar10 = ((long)*pcVar9 + uVar10 * 10) - 0x30;
          } while (uVar10 < 0x10000);
        }
      }
      if (bVar13) {
        return 1;
      }
    }
    return 0;
  }
  bVar1 = *buf;
  uVar7 = (ulong)bVar1;
  if ((bVar1 < 0x21) && (iVar6 = 1, (0x100003600U >> (uVar7 & 0x3f) & 1) != 0)) goto LAB_00108a08;
  switch((is_connect != 0) * '\x04') {
  case '\0':
    iVar6 = 0x1b;
    if (((uVar7 == 0x2a) || (bVar1 == 0x2f)) || (iVar6 = 0x15, (byte)((bVar1 | 0x20) + 0x9f) < 0x1a)
       ) goto LAB_00108a08;
    break;
  case '\x04':
    if (uVar7 == 0x40) {
      iVar6 = 0x1a;
      goto LAB_00108a08;
    }
    if (bVar1 == 0x3f) {
      iVar6 = 0x1c;
      goto LAB_00108a08;
    }
    if (bVar1 == 0x2f) {
      iVar6 = 0x1b;
      goto LAB_00108a08;
    }
    iVar6 = 0x19;
    if (((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 | 0x20) + 0x9f) < 0x1a)) ||
        ((bVar1 - 0x21 < 0x3f && ((0x5400000016003ff9U >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) != 0))
        )) || (bVar1 == 0x7e)) goto LAB_00108a08;
  }
  iVar6 = 1;
LAB_00108a08:
  if (iVar6 - 0x15U < 0xb) {
    iVar6 = (*(code *)((long)&DAT_0010d344 + (long)(int)(&DAT_0010d344)[iVar6 - 0x15U]))
                      (buf,buflen,0,
                       (code *)((long)&DAT_0010d344 + (long)(int)(&DAT_0010d344)[iVar6 - 0x15U]),u,
                       buf + buflen);
    return iVar6;
  }
  if (iVar6 == 1) {
    return 1;
  }
  __assert_fail("!\"Unexpected state\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/third-party/url-parser/url_parser.c"
                ,0x24d,
                "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)");
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}